

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O3

void __thiscall Assimp::ColladaParser::ReadCamera(ColladaParser *this,Camera *pCamera)

{
  char cVar1;
  int iVar2;
  int iVar3;
  ulong in_RAX;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  char *pcVar4;
  char *pcVar5;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  iVar2 = (*this->mReader->_vptr_IIrrXMLReader[2])();
  cVar1 = (char)iVar2;
  do {
    if (cVar1 == '\0') {
      return;
    }
    iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
    iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
    if (iVar2 == 1) {
      if (iVar3 != 1) {
LAB_00425e08:
        __assert_fail("mReader->getNodeType() == irr::io::EXN_ELEMENT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Collada/ColladaParser.h"
                      ,0x178,"bool Assimp::ColladaParser::IsElement(const char *) const");
      }
      iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
      iVar2 = strcmp((char *)CONCAT44(extraout_var,iVar2),"camera");
      if (iVar2 == 0) {
        SkipElement(this);
      }
      else {
        iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
        if (iVar2 != 1) goto LAB_00425e08;
        iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
        iVar2 = strcmp((char *)CONCAT44(extraout_var_00,iVar2),"orthographic");
        if (iVar2 == 0) {
          pCamera->mOrtho = true;
        }
        else {
          iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
          if (iVar2 != 1) goto LAB_00425e08;
          iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
          iVar2 = strcmp((char *)CONCAT44(extraout_var_01,iVar2),"xfov");
          if (iVar2 == 0) {
LAB_00425cf3:
            pcVar5 = GetTextContent(this);
            uStack_38 = uStack_38 & 0xffffffff;
            fast_atoreal_move<float>(pcVar5,(float *)((long)&uStack_38 + 4),true);
            pCamera->mHorFov = uStack_38._4_4_;
            cVar1 = pCamera->mOrtho;
            pcVar5 = "xfov";
            pcVar4 = "xmag";
LAB_00425d75:
            if (cVar1 != '\0') {
              pcVar5 = pcVar4;
            }
          }
          else {
            iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
            if (iVar2 != 1) goto LAB_00425e08;
            iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
            iVar2 = strcmp((char *)CONCAT44(extraout_var_02,iVar2),"xmag");
            if (iVar2 == 0) goto LAB_00425cf3;
            iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
            if (iVar2 != 1) goto LAB_00425e08;
            iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
            iVar2 = strcmp((char *)CONCAT44(extraout_var_03,iVar2),"yfov");
            if (iVar2 == 0) {
LAB_00425d36:
              pcVar5 = GetTextContent(this);
              uStack_38 = uStack_38 & 0xffffffff;
              fast_atoreal_move<float>(pcVar5,(float *)((long)&uStack_38 + 4),true);
              pCamera->mVerFov = uStack_38._4_4_;
              cVar1 = pCamera->mOrtho;
              pcVar5 = "yfov";
              pcVar4 = "ymag";
              goto LAB_00425d75;
            }
            iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
            if (iVar2 != 1) goto LAB_00425e08;
            iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
            iVar2 = strcmp((char *)CONCAT44(extraout_var_04,iVar2),"ymag");
            if (iVar2 == 0) goto LAB_00425d36;
            iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
            if (iVar2 != 1) goto LAB_00425e08;
            iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
            pcVar5 = "aspect_ratio";
            iVar2 = strcmp((char *)CONCAT44(extraout_var_05,iVar2),"aspect_ratio");
            if (iVar2 == 0) {
              pcVar4 = GetTextContent(this);
              uStack_38 = uStack_38 & 0xffffffff;
              fast_atoreal_move<float>(pcVar4,(float *)((long)&uStack_38 + 4),true);
              pCamera->mAspect = uStack_38._4_4_;
            }
            else {
              iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
              if (iVar2 != 1) goto LAB_00425e08;
              iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
              pcVar5 = "znear";
              iVar2 = strcmp((char *)CONCAT44(extraout_var_06,iVar2),"znear");
              if (iVar2 == 0) {
                pcVar4 = GetTextContent(this);
                uStack_38 = uStack_38 & 0xffffffff;
                fast_atoreal_move<float>(pcVar4,(float *)((long)&uStack_38 + 4),true);
                pCamera->mZNear = uStack_38._4_4_;
              }
              else {
                iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
                if (iVar2 != 1) goto LAB_00425e08;
                iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
                iVar2 = strcmp((char *)CONCAT44(extraout_var_07,iVar2),"zfar");
                if (iVar2 != 0) goto LAB_00425d81;
                pcVar5 = GetTextContent(this);
                uStack_38 = uStack_38 & 0xffffffff;
                fast_atoreal_move<float>(pcVar5,(float *)((long)&uStack_38 + 4),true);
                pCamera->mZFar = uStack_38._4_4_;
                pcVar5 = "zfar";
              }
            }
          }
          TestClosing(this,pcVar5);
        }
      }
    }
    else if (iVar3 == 2) {
      iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
      iVar2 = strcmp((char *)CONCAT44(extraout_var_08,iVar2),"camera");
      if (iVar2 == 0) {
        return;
      }
    }
LAB_00425d81:
    iVar2 = (*this->mReader->_vptr_IIrrXMLReader[2])();
    cVar1 = (char)iVar2;
  } while( true );
}

Assistant:

void ColladaParser::ReadCamera(Collada::Camera& pCamera)
{
    while (mReader->read())
    {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT) {
            if (IsElement("camera")) {
                SkipElement();
            }
            else if (IsElement("orthographic")) {
                pCamera.mOrtho = true;
            }
            else if (IsElement("xfov") || IsElement("xmag")) {
                pCamera.mHorFov = ReadFloatFromTextContent();
                TestClosing((pCamera.mOrtho ? "xmag" : "xfov"));
            }
            else if (IsElement("yfov") || IsElement("ymag")) {
                pCamera.mVerFov = ReadFloatFromTextContent();
                TestClosing((pCamera.mOrtho ? "ymag" : "yfov"));
            }
            else if (IsElement("aspect_ratio")) {
                pCamera.mAspect = ReadFloatFromTextContent();
                TestClosing("aspect_ratio");
            }
            else if (IsElement("znear")) {
                pCamera.mZNear = ReadFloatFromTextContent();
                TestClosing("znear");
            }
            else if (IsElement("zfar")) {
                pCamera.mZFar = ReadFloatFromTextContent();
                TestClosing("zfar");
            }
        }
        else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END) {
            if (strcmp(mReader->getNodeName(), "camera") == 0)
                break;
        }
    }
}